

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.cpp
# Opt level: O1

void trt_pose::parse::munkresStep4
               (PairGraph *star_graph,PairGraph *prime_graph,CoverTable *cover_table,
               pair<int,_int> p)

{
  ulong *puVar1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  _Bit_type *p_Var5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  uint uVar10;
  pair<int,_int> pVar11;
  uint *puVar12;
  ulong uVar9;
  
  uVar9 = (ulong)p >> 0x20;
  iVar8 = p.second;
  piVar2 = (star_graph->cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar12 = (uint *)(piVar2 + ((long)p >> 0x20));
  if ((int)*puVar12 < 0) {
    uVar10 = p.first;
  }
  else {
    piVar3 = (star_graph->rows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (prime_graph->rows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = *puVar12;
    do {
      uVar10 = uVar7;
      pVar11.second = 0;
      pVar11.first = uVar10;
      piVar3[uVar10] = -1;
      *puVar12 = 0xffffffff;
      piVar3[p.first] = (int)uVar9;
      *puVar12 = p.first;
      iVar8 = piVar4[uVar10];
      uVar9 = (ulong)iVar8;
      puVar12 = (uint *)(piVar2 + uVar9);
      p = pVar11;
      uVar7 = *puVar12;
    } while (-1 < (int)*puVar12);
  }
  (star_graph->rows).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[(int)uVar10] = iVar8;
  *puVar12 = uVar10;
  iVar8 = cover_table->nrows;
  if (0 < (long)iVar8) {
    p_Var5 = (cover_table->rows).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar9 = 0;
    do {
      bVar6 = (byte)uVar9 & 0x3f;
      puVar1 = p_Var5 + (uVar9 >> 6);
      *puVar1 = *puVar1 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
      uVar9 = uVar9 + 1;
    } while ((long)iVar8 != uVar9);
  }
  iVar8 = cover_table->ncols;
  if (0 < (long)iVar8) {
    p_Var5 = (cover_table->cols).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar9 = 0;
    do {
      bVar6 = (byte)uVar9 & 0x3f;
      puVar1 = p_Var5 + (uVar9 >> 6);
      *puVar1 = *puVar1 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
      uVar9 = uVar9 + 1;
    } while ((long)iVar8 != uVar9);
  }
  utils::PairGraph::clear(prime_graph);
  return;
}

Assistant:

void munkresStep4(PairGraph &star_graph, PairGraph &prime_graph,
                  CoverTable &cover_table, std::pair<int, int> p) {
  // repeat until no star found in prime's column
  while (star_graph.isColSet(p.second)) {
    // find and reset star in prime's column
    std::pair<int, int> s = {star_graph.rowForCol(p.second), p.second};
    star_graph.reset(s.first, s.second);

    // set this prime to a star
    star_graph.set(p.first, p.second);

    // repeat for prime in cleared star's row
    p = {s.first, prime_graph.colForRow(s.first)};
  }
  star_graph.set(p.first, p.second);
  cover_table.clear();
  prime_graph.clear();
}